

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O0

void console_print_error_msg(char *prefix,char *msg)

{
  undefined1 local_54 [8];
  termios cf;
  char *msg_local;
  char *prefix_local;
  
  cf._52_8_ = msg;
  premsg((termios *)local_54);
  fputs(prefix,_stderr);
  fputs(": ",_stderr);
  fputs((char *)cf._52_8_,_stderr);
  fputc(10,_stderr);
  fflush(_stderr);
  postmsg((termios *)local_54);
  return;
}

Assistant:

void console_print_error_msg(const char *prefix, const char *msg)
{
    struct termios cf;
    premsg(&cf);
    fputs(prefix, stderr);
    fputs(": ", stderr);
    fputs(msg, stderr);
    fputc('\n', stderr);
    fflush(stderr);
    postmsg(&cf);
}